

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

void __thiscall lzham::lzcompressor::clear(lzcompressor *this)

{
  parse_thread_state *ppVar1;
  uchar *puVar2;
  lzdecision *plVar3;
  undefined1 auVar4 [16];
  long lVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  void *extraout_RDX_01;
  lzcompressor *plVar7;
  uint i;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar10;
  
  lzham::symbol_codec::clear();
  this->m_src_size = -1;
  this->m_src_adler32 = 1;
  puVar2 = (this->m_block_buf).m_p;
  pvVar6 = extraout_RDX;
  if (puVar2 != (uchar *)0x0) {
    lzham::lzham_free((lzham *)(this->m_block_buf).m_malloc_context,puVar2,extraout_RDX);
    (this->m_block_buf).m_p = (uchar *)0x0;
    (this->m_block_buf).m_size = 0;
    (this->m_block_buf).m_capacity = 0;
    pvVar6 = extraout_RDX_00;
  }
  puVar2 = (this->m_comp_buf).m_p;
  if (puVar2 != (uchar *)0x0) {
    lzham::lzham_free((lzham *)(this->m_comp_buf).m_malloc_context,puVar2,pvVar6);
    (this->m_comp_buf).m_p = (uchar *)0x0;
    (this->m_comp_buf).m_size = 0;
    (this->m_comp_buf).m_capacity = 0;
  }
  lVar8 = 0;
  *(undefined8 *)((long)&this->m_block_start_dict_ofs + 3) = 0;
  this->m_step = 0;
  this->m_block_start_dict_ofs = 0;
  state::clear(&this->m_state);
  this->m_fast_bytes = 0x80;
  this->m_num_parse_threads = 0;
  plVar7 = this;
  do {
    ppVar1 = this->m_parse_thread_state + lVar8;
    state::clear(&this->m_parse_thread_state[lVar8].super_raw_parse_thread_state.m_state);
    auVar4 = _DAT_00111040;
    lVar5 = 0x4e90;
    auVar9 = _DAT_00111030;
    auVar11 = _DAT_00111020;
    do {
      auVar12 = auVar9 ^ auVar4;
      if (auVar12._4_4_ == -0x80000000 && auVar12._0_4_ < -0x7ffff3ff) {
        *(undefined4 *)((long)plVar7 + lVar5 + -0x558) = 0;
        *(undefined4 *)((long)plVar7 + lVar5 + -0x390) = 0;
      }
      auVar12 = auVar11 ^ auVar4;
      if (auVar12._4_4_ == -0x80000000 && auVar12._0_4_ < -0x7ffff3ff) {
        *(undefined4 *)((long)plVar7 + lVar5 + -0x1c8) = 0;
        *(undefined4 *)((long)&(plVar7->super_CLZBase).super_CLZDecompBase.m_dict_size_log2 + lVar5)
             = 0;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar10 + 4;
      lVar10 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar10 + 4;
      lVar5 = lVar5 + 0x720;
    } while (lVar5 != 0x15b5b0);
    (ppVar1->super_raw_parse_thread_state).m_start_ofs = 0;
    (ppVar1->super_raw_parse_thread_state).m_bytes_to_match = 0;
    plVar3 = (ppVar1->super_raw_parse_thread_state).m_best_decisions.m_p;
    if (plVar3 != (lzdecision *)0x0) {
      lzham::lzham_free((lzham *)(ppVar1->super_raw_parse_thread_state).m_best_decisions.
                                 m_malloc_context,plVar3,extraout_RDX_01);
      (ppVar1->super_raw_parse_thread_state).m_best_decisions.m_p = (lzdecision *)0x0;
      (ppVar1->super_raw_parse_thread_state).m_best_decisions.m_size = 0;
      (ppVar1->super_raw_parse_thread_state).m_best_decisions.m_capacity = 0;
    }
    (ppVar1->super_raw_parse_thread_state).m_issue_reset_state_partial = false;
    (ppVar1->super_raw_parse_thread_state).m_failed = false;
    (ppVar1->super_raw_parse_thread_state).m_emit_decisions_backwards = false;
    (ppVar1->super_raw_parse_thread_state).m_parse_early_out_thresh = 0xffffffff;
    (ppVar1->super_raw_parse_thread_state).m_bytes_actually_parsed = 0;
    lVar8 = lVar8 + 1;
    plVar7 = (lzcompressor *)
             (plVar7->m_parse_thread_state[0].super_raw_parse_thread_state.m_nodes[0xbdb].
              m_node_states + 3);
  } while (lVar8 != 8);
  return;
}

Assistant:

void lzcompressor::clear()
   {
      m_codec.clear();
      m_src_size = -1;
      m_src_adler32 = cInitAdler32;
      m_block_buf.clear();
      m_comp_buf.clear();

      m_step = 0;
      m_finished = false;
      m_use_task_pool = false;
      m_use_extreme_parsing = false;
      m_block_start_dict_ofs = 0;
      m_block_index = 0;
      m_state.clear();
      m_num_parse_threads = 0;
      m_fast_bytes = 128;

      for (uint i = 0; i < cMaxParseThreads; i++)
      {
         parse_thread_state &parse_state = m_parse_thread_state[i];
         parse_state.m_state.clear();

         for (uint j = 0; j <= cMaxParseGraphNodes; j++)
            parse_state.m_nodes[j].clear();

         parse_state.m_start_ofs = 0;
         parse_state.m_bytes_to_match = 0;
         parse_state.m_best_decisions.clear();
         parse_state.m_issue_reset_state_partial = false;
         parse_state.m_emit_decisions_backwards = false;
         parse_state.m_failed = false;
         parse_state.m_parse_early_out_thresh = UINT_MAX;
         parse_state.m_bytes_actually_parsed = 0;
      }
   }